

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::pumpLoop
          (AsyncIoStreamWithInitialBuffer *this,AsyncOutputStream *output,uint64_t remaining,
          uint64_t total)

{
  anon_class_40_5_6467afc8_for_func *this_00;
  _func_int **pp_Var1;
  anon_class_40_5_6467afc8_for_func local_60;
  _func_int **local_38;
  
  pp_Var1 = output[8]._vptr_AsyncOutputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    (**(code **)(*output[3]._vptr_AsyncOutputStream + 0x18))
              (&local_60.output,output[3]._vptr_AsyncOutputStream,remaining,total);
    Promise<unsigned_long>::
    then<kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda(auto:1)_1_>
              ((Promise<unsigned_long> *)this,(anon_class_8_1_a8b0ca64_for_func *)&local_60.output);
    this_00 = (anon_class_40_5_6467afc8_for_func *)&local_60.output;
  }
  else {
    if (total <= pp_Var1) {
      pp_Var1 = (_func_int **)total;
    }
    (*(code *)**(undefined8 **)remaining)
              (&local_60,remaining,output[7]._vptr_AsyncOutputStream,pp_Var1);
    local_60.output = output;
    local_60.remaining = remaining;
    local_60.total = total;
    local_38 = pp_Var1;
    Promise<void>::
    then<kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,&local_60);
    this_00 = &local_60;
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_00);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpLoop(
      kj::AsyncOutputStream& output,
      uint64_t remaining,
      uint64_t total) {
    // If there is any data remaining in the leftover queue, we'll write it out first to output.
    if (leftover.size() > 0) {
      auto bytesToWrite = kj::min(leftover.size(), remaining);
      return output.write(leftover.first(bytesToWrite)).then(
          [this, &output, remaining, total, bytesToWrite]() mutable -> kj::Promise<uint64_t> {
        leftover = leftover.slice(bytesToWrite, leftover.size());
        // If the leftover buffer has been fully consumed, go ahead and free it now.
        if (leftover.size() == 0) {
          leftoverBackingBuffer = nullptr;
        }
        remaining -= bytesToWrite;
        total += bytesToWrite;

        if (remaining == 0) {
          return total;
        }
        return pumpLoop(output, remaining, total);
      });
    } else {
      // Otherwise, we are just going to defer to stream's pumpTo, making sure to
      // account for the total amount we've already written from the leftover queue.
      return stream->pumpTo(output, remaining).then([total](auto read) {
        return total + read;
      });
    }
  }